

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O1

void __thiscall
dbwrapper_tests::iterator_string_ordering::test_method(iterator_string_ordering *this)

{
  ulong uVar1;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> this_00;
  bool bVar2;
  readonly_property<bool> rVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  int iVar9;
  uint uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar12;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 local_30c [20];
  char *local_2f8;
  char *local_2f0;
  undefined1 local_2e8 [16];
  undefined1 *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  uint32_t value_1;
  uint local_210;
  int seek_start;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> it;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  string *local_1d0;
  StringContentsSerializer *local_1c8;
  uint32_t value;
  undefined4 uStack_1bc;
  char *local_1b8;
  assertion_result local_1b0;
  StringContentsSerializer key_1;
  undefined8 local_178;
  string exp_key;
  string key;
  CDBWrapper dbw;
  path local_a8;
  path ph;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_a8,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_a8,0x18,"iterator_string_ordering");
  std::filesystem::__cxx11::path::path(&ph.super_path,&local_a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::filesystem::__cxx11::path::path((path *)&key,&ph.super_path);
  CDBWrapper::CDBWrapper(&dbw,(DBParams *)&key);
  std::filesystem::__cxx11::path::~path((path *)&key);
  local_1b0._0_4_ = 0;
  iVar5 = 0;
  do {
    do {
      util::ToString<int>(&key,(int *)&local_1b0);
      for (iVar9 = iVar5; iVar9 != 0; iVar9 = iVar9 + -1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                   key._M_dataplus._M_p,
                   CONCAT71(key._M_string_length._1_7_,(undefined1)key._M_string_length));
      }
      uVar1 = (ulong)_value >> 0x20;
      _value = (char *)CONCAT44((int)uVar1,local_1b0._0_4_ * local_1b0._0_4_);
      local_1e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_1d8 = "";
      local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x169;
      file.m_begin = (iterator)&local_1e0;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1f0,msg)
      ;
      local_58._0_8_ = &aStack_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,key._M_dataplus._M_p,
                 key._M_dataplus._M_p +
                 CONCAT71(key._M_string_length._1_7_,(undefined1)key._M_string_length));
      _cVar12 = 0x38031f;
      bVar2 = CDBWrapper::Write<dbwrapper_tests::StringContentsSerializer,unsigned_int>
                        (&dbw,(StringContentsSerializer *)local_58,&value,false);
      key_1.str._M_dataplus._M_p._0_1_ = bVar2;
      key_1.str._M_string_length = 0;
      key_1.str.field_2._M_allocated_capacity = 0;
      local_2e8._0_8_ = "dbw.Write(StringContentsSerializer{key}, value)";
      local_2e8._8_8_ = "";
      exp_key._M_string_length = exp_key._M_string_length & 0xffffffffffffff00;
      exp_key._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3df0;
      exp_key.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      exp_key.field_2._8_8_ = local_2e8;
      local_200 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_1f8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&key_1,(lazy_ostream *)&exp_key,1,0,WARN,_cVar12,
                 (size_t)&local_200,0x169);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&key_1.str.field_2._M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &aStack_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key._M_dataplus._M_p != &key.field_2) {
        operator_delete(key._M_dataplus._M_p,key.field_2._M_allocated_capacity + 1);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != 10);
    iVar9 = local_1b0._0_4_ + 1;
    iVar5 = 0;
    bVar2 = (int)local_1b0._0_4_ < 9;
    local_1b0._0_4_ = iVar9;
  } while (bVar2);
  it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       CDBWrapper::NewIterator(&dbw);
  local_178 = 0x500000000;
  lVar4 = 0;
  do {
    this_00._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
    super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
    super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
         it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
         super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
         super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl;
    seek_start = *(int *)((long)&local_178 + lVar4);
    util::ToString<int>((string *)local_58,&seek_start);
    key._M_dataplus._M_p = (pointer)&key.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&key,local_58._0_8_,
               (char *)(local_58._0_8_ + (long)(wrapped_stream *)local_58._8_8_));
    CDBIterator::Seek<dbwrapper_tests::StringContentsSerializer>
              ((CDBIterator *)
               this_00._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
               _M_t.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
               super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,
               (StringContentsSerializer *)&key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key._M_dataplus._M_p != &key.field_2) {
      operator_delete(key._M_dataplus._M_p,key.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &aStack_48) {
      operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
    }
    local_210 = seek_start;
    if ((uint)seek_start < 10) {
      uVar10 = 0;
LAB_00380542:
      do {
        util::ToString<unsigned_int>(&exp_key,&local_210);
        for (uVar6 = uVar10; uVar6 != 0; uVar6 = uVar6 - 1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&exp_key,exp_key._M_dataplus._M_p,exp_key._M_string_length);
        }
        key_1.str._M_dataplus._M_p = (pointer)&key_1.str.field_2;
        key_1.str._M_string_length = 0;
        key_1.str.field_2._M_allocated_capacity =
             key_1.str.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_228 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_220 = "";
        local_238 = &boost::unit_test::basic_cstring<char_const>::null;
        local_230 = &boost::unit_test::basic_cstring<char_const>::null;
        file_00.m_end = (iterator)0x177;
        file_00.m_begin = (iterator)&local_228;
        msg_00.m_end = in_R9;
        msg_00.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_238
                   ,msg_00);
        _cVar12 = 0x3805f6;
        bVar2 = CDBIterator::Valid((CDBIterator *)
                                   it._M_t.
                                   super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                   .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
        local_58[0] = (class_property<bool>)(class_property<bool>)bVar2;
        local_58._8_8_ = (element_type *)0x0;
        aStack_48._M_allocated_capacity = 0;
        local_2e8._0_8_ = "it->Valid()";
        local_2e8._8_8_ = "";
        key._M_string_length._0_1_ = 0;
        key._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3df0;
        key.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        key.field_2._8_8_ = local_2e8;
        local_248 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_240 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,(lazy_ostream *)&key,1,0,WARN,_cVar12,
                   (size_t)&local_248,0x177);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity)
        ;
        bVar2 = CDBIterator::Valid((CDBIterator *)
                                   it._M_t.
                                   super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                   .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
        if (bVar2) {
          local_258 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
          ;
          local_250 = "";
          local_268 = &boost::unit_test::basic_cstring<char_const>::null;
          local_260 = &boost::unit_test::basic_cstring<char_const>::null;
          file_01.m_end = (iterator)0x17a;
          file_01.m_begin = (iterator)&local_258;
          msg_01.m_end = in_R9;
          msg_01.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_268,msg_01);
          _cVar12 = 0x380727;
          rVar3.super_class_property<bool>.value =
               (class_property<bool>)
               CDBIterator::GetKey<dbwrapper_tests::StringContentsSerializer>
                         ((CDBIterator *)
                          it._M_t.
                          super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t
                          .super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                          super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key_1);
          local_58._8_8_ = (element_type *)0x0;
          aStack_48._M_allocated_capacity = 0;
          local_2e8._0_8_ = "it->GetKey(key)";
          local_2e8._8_8_ = "";
          key._M_string_length._0_1_ = 0;
          key._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3df0;
          key.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          key.field_2._8_8_ = local_2e8;
          local_278 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
          ;
          local_270 = "";
          pvVar7 = (iterator)0x1;
          pvVar8 = (iterator)0x0;
          local_58[0] = rVar3.super_class_property<bool>.value;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,(lazy_ostream *)&key,1,0,WARN,_cVar12,
                     (size_t)&local_278,0x17a);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_48._M_allocated_capacity);
          local_288 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
          ;
          local_280 = "";
          local_298 = &boost::unit_test::basic_cstring<char_const>::null;
          local_290 = &boost::unit_test::basic_cstring<char_const>::null;
          file_02.m_end = (iterator)0x17b;
          file_02.m_begin = (iterator)&local_288;
          msg_02.m_end = pvVar8;
          msg_02.m_begin = pvVar7;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                     (size_t)&local_298,msg_02);
          _cVar12 = 0x38083d;
          local_58[0] = (class_property<bool>)
                        CDBIterator::GetValue<unsigned_int>
                                  ((CDBIterator *)
                                   it._M_t.
                                   super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                   .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,
                                   &value_1);
          local_58._8_8_ = (element_type *)0x0;
          aStack_48._M_allocated_capacity = 0;
          local_2e8._0_8_ = "it->GetValue(value)";
          local_2e8._8_8_ = "";
          key._M_string_length._0_1_ = 0;
          key._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3df0;
          key.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          key.field_2._8_8_ = local_2e8;
          local_2a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
          ;
          local_2a0 = "";
          pvVar7 = (iterator)0x1;
          pvVar8 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,(lazy_ostream *)&key,1,0,WARN,_cVar12,
                     (size_t)&local_2a8,0x17b);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_48._M_allocated_capacity);
          local_2b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
          ;
          local_2b0 = "";
          local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_03.m_end = (iterator)0x17c;
          file_03.m_begin = (iterator)&local_2b8;
          msg_03.m_end = pvVar8;
          msg_03.m_begin = pvVar7;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_2c8,msg_03);
          local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
          local_2e8._0_8_ = &PTR__lazy_ostream_013d3cb0;
          local_2d8 = boost::unit_test::lazy_ostream::inst;
          local_2d0 = "";
          if (key_1.str._M_string_length == exp_key._M_string_length) {
            if (key_1.str._M_string_length == 0) {
              rVar3.super_class_property<bool>.value = (class_property<bool>)true;
            }
            else {
              iVar5 = bcmp(key_1.str._M_dataplus._M_p,exp_key._M_dataplus._M_p,
                           key_1.str._M_string_length);
              rVar3.super_class_property<bool>.value = (class_property<bool>)(iVar5 == 0);
            }
          }
          else {
            rVar3.super_class_property<bool>.value = (class_property<bool>)false;
          }
          local_1b0.m_message.px = (element_type *)0x0;
          local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          _value = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
          ;
          local_1b8 = "";
          local_1c8 = &key_1;
          key._M_string_length._0_1_ = 0;
          key._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3d70;
          key.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          key.field_2._8_8_ = &local_1c8;
          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
          local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
          aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          aStack_48._8_8_ = &local_1d0;
          pvVar7 = (iterator)0x1;
          pvVar8 = (iterator)0x2;
          local_1d0 = &exp_key;
          local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)rVar3.super_class_property<bool>.value;
          boost::test_tools::tt_detail::report_assertion
                    (&local_1b0,(lazy_ostream *)local_2e8,1,2,REQUIRE,0xeab3b0,(size_t)&value,0x17c,
                     (path *)&key,"exp_key",local_58);
          boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
          local_2f8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
          ;
          local_2f0 = "";
          local_30c._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
          local_30c._12_8_ = &boost::unit_test::basic_cstring<char_const>::null;
          file_04.m_end = (iterator)0x17d;
          file_04.m_begin = (iterator)&local_2f8;
          msg_04.m_end = pvVar8;
          msg_04.m_begin = pvVar7;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                     (size_t)(local_30c + 4),msg_04);
          local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
          local_2e8._0_8_ = &PTR__lazy_ostream_013d3cb0;
          local_2d8 = boost::unit_test::lazy_ostream::inst;
          local_2d0 = "";
          local_30c._0_4_ = local_210 * local_210;
          local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)(value_1 == local_30c._0_4_);
          local_1b0.m_message.px = (element_type *)0x0;
          local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
          _value = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
          ;
          local_1b8 = "";
          local_1c8 = (StringContentsSerializer *)&value_1;
          key._M_string_length._0_1_ = 0;
          key._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3d30;
          key.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          key.field_2._8_8_ = &local_1c8;
          local_1d0 = (string *)local_30c;
          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
          local_58._0_8_ = &PTR__lazy_ostream_013d3d30;
          aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          aStack_48._8_8_ = &local_1d0;
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_1b0,(lazy_ostream *)local_2e8,1,2,REQUIRE,0xe779b5,(size_t)&value,0x17d,
                     (path *)&key,"x*x",local_58);
          boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
          CDBIterator::Next((CDBIterator *)
                            it._M_t.
                            super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                            .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)key_1.str._M_dataplus._M_p != &key_1.str.field_2) {
            operator_delete(key_1.str._M_dataplus._M_p,key_1.str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)exp_key._M_dataplus._M_p != &exp_key.field_2) {
            operator_delete(exp_key._M_dataplus._M_p,exp_key.field_2._M_allocated_capacity + 1);
          }
          bVar11 = uVar10 < 9;
          uVar10 = uVar10 + 1;
          if (bVar2 && bVar11) goto LAB_00380542;
        }
        else {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)key_1.str._M_dataplus._M_p != &key_1.str.field_2) {
            operator_delete(key_1.str._M_dataplus._M_p,key_1.str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)exp_key._M_dataplus._M_p != &exp_key.field_2) {
            operator_delete(exp_key._M_dataplus._M_p,exp_key.field_2._M_allocated_capacity + 1);
          }
        }
        local_210 = local_210 + 1;
        uVar10 = 0;
      } while (local_210 < 10);
    }
    local_320 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_318 = "";
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    local_328 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x181;
    file_05.m_begin = (iterator)&local_320;
    msg_05.m_end = in_R9;
    msg_05.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_330,
               msg_05);
    _cVar12 = 0x380d5d;
    bVar2 = CDBIterator::Valid((CDBIterator *)
                               it._M_t.
                               super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                               .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    local_58[0] = (class_property<bool>)(class_property<bool>)!bVar2;
    local_58._8_8_ = (element_type *)0x0;
    aStack_48._M_allocated_capacity = 0;
    exp_key._M_dataplus._M_p = "!it->Valid()";
    exp_key._M_string_length = (long)"!it->Valid()" + 0xc;
    key._M_string_length._0_1_ = 0;
    key._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3df0;
    key.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_340 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_338 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    key.field_2._8_8_ = &exp_key;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_58,(lazy_ostream *)&key,1,0,WARN,_cVar12,(size_t)&local_340
               ,0x181);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
    lVar4 = lVar4 + 4;
    if (lVar4 == 8) {
      std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&it);
      CDBWrapper::~CDBWrapper(&dbw);
      std::filesystem::__cxx11::path::~path(&ph.super_path);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(iterator_string_ordering)
{
    fs::path ph = m_args.GetDataDirBase() / "iterator_string_ordering";
    CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = true, .wipe_data = false, .obfuscate = false});
    for (int x = 0; x < 10; ++x) {
        for (int y = 0; y < 10; ++y) {
            std::string key{ToString(x)};
            for (int z = 0; z < y; ++z)
                key += key;
            uint32_t value = x*x;
            BOOST_CHECK(dbw.Write(StringContentsSerializer{key}, value));
        }
    }

    std::unique_ptr<CDBIterator> it(const_cast<CDBWrapper&>(dbw).NewIterator());
    for (const int seek_start : {0, 5}) {
        it->Seek(StringContentsSerializer{ToString(seek_start)});
        for (unsigned int x = seek_start; x < 10; ++x) {
            for (int y = 0; y < 10; ++y) {
                std::string exp_key{ToString(x)};
                for (int z = 0; z < y; ++z)
                    exp_key += exp_key;
                StringContentsSerializer key;
                uint32_t value;
                BOOST_CHECK(it->Valid());
                if (!it->Valid()) // Avoid spurious errors about invalid iterator's key and value in case of failure
                    break;
                BOOST_CHECK(it->GetKey(key));
                BOOST_CHECK(it->GetValue(value));
                BOOST_CHECK_EQUAL(key.str, exp_key);
                BOOST_CHECK_EQUAL(value, x*x);
                it->Next();
            }
        }
        BOOST_CHECK(!it->Valid());
    }
}